

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O3

int __thiscall cmCPackIFWGenerator::InitializeInternal(cmCPackIFWGenerator *this)

{
  cmCPackIFWCommon *this_00;
  pointer *pppcVar1;
  _func_int **pp_Var2;
  iterator __position;
  cmCPackLog *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  string *psVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RepoAllVector;
  string RepoGenOpt;
  string BinCreatorOpt;
  string FrameworkVersionOpt;
  ostringstream cmCPackLog_msg;
  allocator local_229;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"CPACK_IFW_BINARYCREATOR_EXECUTABLE","");
  local_208._M_allocated_capacity = (size_type)&local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"CPACK_IFW_REPOGEN_EXECUTABLE","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"CPACK_IFW_FRAMEWORK_VERSION","");
  bVar5 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1e8);
  if (((!bVar5) ||
      (bVar5 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&local_208), !bVar5))
     || (bVar5 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_1c8), !bVar5)) {
    cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackIFW.cmake");
  }
  this_00 = &this->super_cmCPackIFWCommon;
  pcVar7 = cmCPackIFWCommon::GetOption(this_00,&local_1e8);
  pcVar9 = "";
  if ((pcVar7 != (char *)0x0) && (bVar5 = cmSystemTools::IsNOTFOUND((char *)0x290f3b), !bVar5)) {
    strlen(pcVar7);
    pcVar9 = pcVar7;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->BinCreator,0,(char *)(this->BinCreator)._M_string_length,(ulong)pcVar9);
  if ((this->BinCreator)._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Cannot find QtIFW compiler \"binarycreator\": likely it is not installed, or not in your PATH"
               ,0x5b);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    if (this_00->Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (this_00->Generator->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_228._0_8_;
      sVar8 = strlen((char *)local_228._0_8_);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0xec,(char *)uVar4,sVar8);
LAB_00291554:
      if ((string *)local_228._0_8_ != (string *)(local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
      }
    }
  }
  else {
    pcVar7 = cmCPackIFWCommon::GetOption(this_00,(string *)&local_208);
    pcVar9 = "";
    if ((pcVar7 != (char *)0x0) && (bVar5 = cmSystemTools::IsNOTFOUND((char *)0x290f98), !bVar5)) {
      strlen(pcVar7);
      pcVar9 = pcVar7;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->RepoGen,0,(char *)(this->RepoGen)._M_string_length,(ulong)pcVar9);
    pcVar7 = cmCPackIFWCommon::GetOption(this_00,&local_1c8);
    pcVar9 = (char *)(this->FrameworkVersion)._M_string_length;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "1.9.9";
    }
    else {
      strlen(pcVar7);
    }
    std::__cxx11::string::_M_replace((ulong)&this->FrameworkVersion,0,pcVar9,(ulong)pcVar7);
    pp_Var2 = (_func_int **)(local_1a8 + 0x10);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_RESOLVE_DUPLICATE_NAMES","");
    bVar5 = cmCPackIFWCommon::IsOn(this_00,(string *)local_1a8);
    this->ResolveDuplicateNames = bVar5;
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->PkgsDirsVector,
                      (this->PkgsDirsVector).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_PACKAGES_DIRECTORIES","");
    pcVar9 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar9 != (char *)0x0) {
      local_1a8._0_8_ = pp_Var2;
      sVar8 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar9,pcVar9 + sVar8);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&this->PkgsDirsVector,false);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
    }
    (this->Installer).super_cmCPackIFWCommon.Generator = this;
    cmCPackIFWInstaller::ConfigureFromOptions(&this->Installer);
    (this->Repository).super_cmCPackIFWCommon.Generator = this;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->Repository).Name,0,(char *)(this->Repository).Name._M_string_length,
               0x5afba1);
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_DOWNLOAD_SITE","");
    pcVar9 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar9 != (char *)0x0) {
      pcVar7 = (char *)(this->Repository).Url._M_string_length;
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&(this->Repository).Url,0,pcVar7,(ulong)pcVar9);
      local_1a8._0_8_ = &this->Repository;
      __position._M_current =
           (this->Installer).RemoteRepositories.
           super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->Installer).RemoteRepositories.
          super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>>::
        _M_realloc_insert<cmCPackIFWRepository*>
                  ((vector<cmCPackIFWRepository*,std::allocator<cmCPackIFWRepository*>> *)
                   &(this->Installer).RemoteRepositories,__position,
                   (cmCPackIFWRepository **)local_1a8);
      }
      else {
        *__position._M_current = (cmCPackIFWRepository *)local_1a8._0_8_;
        pppcVar1 = &(this->Installer).RemoteRepositories.
                    super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar1 = *pppcVar1 + 1;
      }
    }
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_IFW_REPOSITORIES_ALL","");
    pcVar9 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar9 != (char *)0x0) {
      local_228._0_8_ = (string *)0x0;
      local_228._8_8_ = (string *)0x0;
      local_228._16_8_ = (pointer)0x0;
      local_1a8._0_8_ = pp_Var2;
      sVar8 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar9,pcVar9 + sVar8);
      cmSystemTools::ExpandListArgument
                ((string *)local_1a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_228,false);
      psVar10 = (string *)local_228._0_8_;
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
        psVar10 = (string *)local_228._0_8_;
      }
      for (; psVar10 != (string *)local_228._8_8_; psVar10 = psVar10 + 1) {
        GetRepository(this,psVar10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_228);
    }
    local_1a8._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_IFW_DOWNLOAD_ALL","")
    ;
    pcVar9 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
    if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    if (pcVar9 == (char *)0x0) {
      local_1a8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_DOWNLOAD_ALL","");
      pcVar9 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      if (pcVar9 != (char *)0x0) {
        bVar5 = cmSystemTools::IsOn(pcVar9);
        goto LAB_0029147b;
      }
      this->OnlineOnly = false;
    }
    else {
      bVar5 = cmSystemTools::IsOn(pcVar9);
LAB_0029147b:
      this->OnlineOnly = bVar5;
    }
    if (((this->Installer).RemoteRepositories.
         super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl
         .super__Vector_impl_data._M_start ==
         (this->Installer).RemoteRepositories.
         super__Vector_base<cmCPackIFWRepository_*,_std::allocator<cmCPackIFWRepository_*>_>._M_impl
         .super__Vector_impl_data._M_finish) || ((this->RepoGen)._M_string_length != 0)) {
      local_1a8._0_8_ = pp_Var2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CMAKE_EXECUTABLE_SUFFIX","");
      pcVar9 = cmCPackIFWCommon::GetOption(this_00,(string *)local_1a8);
      if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
        operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
      }
      psVar10 = &this->ExecutableSuffix;
      pcVar7 = (char *)(this->ExecutableSuffix)._M_string_length;
      if (pcVar9 == (char *)0x0) {
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar7,0x5adc67);
      }
      else {
        strlen(pcVar9);
        std::__cxx11::string::_M_replace((ulong)psVar10,0,pcVar7,(ulong)pcVar9);
        if ((this->ExecutableSuffix)._M_string_length == 0) {
          local_228._0_8_ = (string *)(local_228 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_228,"CMAKE_SYSTEM_NAME","");
          pcVar9 = cmCPackIFWCommon::GetOption(this_00,(string *)local_228);
          std::__cxx11::string::string((string *)local_1a8,pcVar9,&local_229);
          if ((string *)local_228._0_8_ != (string *)(local_228 + 0x10)) {
            operator_delete((void *)local_228._0_8_,(ulong)(local_228._16_8_ + 1));
          }
          iVar6 = std::__cxx11::string::compare(local_1a8);
          if (iVar6 == 0) {
            std::__cxx11::string::_M_replace
                      ((ulong)psVar10,0,(char *)(this->ExecutableSuffix)._M_string_length,0x5afc85);
          }
          if ((_func_int **)local_1a8._0_8_ != pp_Var2) {
            operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
          }
        }
      }
      iVar6 = cmCPackGenerator::InitializeInternal(&this->super_cmCPackGenerator);
      goto LAB_00291703;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "Cannot find QtIFW repository generator \"repogen\": likely it is not installed, or not in your PATH"
               ,0x61);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    if (this_00->Generator != (cmCPackIFWGenerator *)0x0) {
      pcVar3 = (this_00->Generator->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      uVar4 = local_228._0_8_;
      sVar8 = strlen((char *)local_228._0_8_);
      cmCPackLog::Log(pcVar3,0x10,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                      ,0x12f,(char *)uVar4,sVar8);
      goto LAB_00291554;
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar6 = 0;
LAB_00291703:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_allocated_capacity != &local_1f8) {
    operator_delete((void *)local_208._M_allocated_capacity,local_1f8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int cmCPackIFWGenerator::InitializeInternal()
{
  // Search Qt Installer Framework tools

  const std::string BinCreatorOpt = "CPACK_IFW_BINARYCREATOR_EXECUTABLE";
  const std::string RepoGenOpt = "CPACK_IFW_REPOGEN_EXECUTABLE";
  const std::string FrameworkVersionOpt = "CPACK_IFW_FRAMEWORK_VERSION";

  if (!this->IsSet(BinCreatorOpt) || !this->IsSet(RepoGenOpt) ||
      !this->IsSet(FrameworkVersionOpt)) {
    this->ReadListFile("CPackIFW.cmake");
  }

  // Look 'binarycreator' executable (needs)

  const char* BinCreatorStr = this->GetOption(BinCreatorOpt);
  if (!BinCreatorStr || cmSystemTools::IsNOTFOUND(BinCreatorStr)) {
    this->BinCreator = "";
  } else {
    this->BinCreator = BinCreatorStr;
  }

  if (this->BinCreator.empty()) {
    cmCPackIFWLogger(ERROR, "Cannot find QtIFW compiler \"binarycreator\": "
                            "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Look 'repogen' executable (optional)

  const char* RepoGenStr = this->GetOption(RepoGenOpt);
  if (!RepoGenStr || cmSystemTools::IsNOTFOUND(RepoGenStr)) {
    this->RepoGen = "";
  } else {
    this->RepoGen = RepoGenStr;
  }

  // Framework version
  if (const char* FrameworkVersionSrt = this->GetOption(FrameworkVersionOpt)) {
    this->FrameworkVersion = FrameworkVersionSrt;
  } else {
    this->FrameworkVersion = "1.9.9";
  }

  // Variables that Change Behavior

  // Resolve duplicate names
  this->ResolveDuplicateNames =
    this->IsOn("CPACK_IFW_RESOLVE_DUPLICATE_NAMES");

  // Additional packages dirs
  this->PkgsDirsVector.clear();
  if (const char* dirs = this->GetOption("CPACK_IFW_PACKAGES_DIRECTORIES")) {
    cmSystemTools::ExpandListArgument(dirs, this->PkgsDirsVector);
  }

  // Installer
  this->Installer.Generator = this;
  this->Installer.ConfigureFromOptions();

  // Repository
  this->Repository.Generator = this;
  this->Repository.Name = "Unspecified";
  if (const char* site = this->GetOption("CPACK_DOWNLOAD_SITE")) {
    this->Repository.Url = site;
    this->Installer.RemoteRepositories.push_back(&this->Repository);
  }

  // Repositories
  if (const char* RepoAllStr = this->GetOption("CPACK_IFW_REPOSITORIES_ALL")) {
    std::vector<std::string> RepoAllVector;
    cmSystemTools::ExpandListArgument(RepoAllStr, RepoAllVector);
    for (std::vector<std::string>::iterator rit = RepoAllVector.begin();
         rit != RepoAllVector.end(); ++rit) {
      this->GetRepository(*rit);
    }
  }

  if (const char* ifwDownloadAll = this->GetOption("CPACK_IFW_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(ifwDownloadAll);
  } else if (const char* cpackDownloadAll =
               this->GetOption("CPACK_DOWNLOAD_ALL")) {
    this->OnlineOnly = cmSystemTools::IsOn(cpackDownloadAll);
  } else {
    this->OnlineOnly = false;
  }

  if (!this->Installer.RemoteRepositories.empty() && this->RepoGen.empty()) {
    cmCPackIFWLogger(ERROR,
                     "Cannot find QtIFW repository generator \"repogen\": "
                     "likely it is not installed, or not in your PATH"
                       << std::endl);
    return 0;
  }

  // Executable suffix
  if (const char* optExeSuffix = this->GetOption("CMAKE_EXECUTABLE_SUFFIX")) {
    this->ExecutableSuffix = optExeSuffix;
    if (this->ExecutableSuffix.empty()) {
      std::string sysName(this->GetOption("CMAKE_SYSTEM_NAME"));
      if (sysName == "Linux") {
        this->ExecutableSuffix = ".run";
      }
    }
  } else {
    this->ExecutableSuffix = this->cmCPackGenerator::GetOutputExtension();
  }

  return this->Superclass::InitializeInternal();
}